

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_move_16_toc_pcdi(void)

{
  uint value;
  
  value = OPER_PCDI_16();
  m68ki_set_ccr(value);
  return;
}

Assistant:

static void m68k_op_move_16_toc_pcdi(void)
{
	m68ki_set_ccr(OPER_PCDI_16());
}